

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O0

void __thiscall
leveldb::InternalKey::InternalKey(InternalKey *this,Slice *user_key,SequenceNumber s,ValueType t)

{
  ParsedInternalKey local_48;
  ValueType local_24;
  SequenceNumber SStack_20;
  ValueType t_local;
  SequenceNumber s_local;
  Slice *user_key_local;
  InternalKey *this_local;
  
  local_24 = t;
  SStack_20 = s;
  s_local = (SequenceNumber)user_key;
  user_key_local = (Slice *)this;
  std::__cxx11::string::string((string *)this);
  ParsedInternalKey::ParsedInternalKey(&local_48,(Slice *)s_local,&stack0xffffffffffffffe0,local_24)
  ;
  AppendInternalKey(&this->rep_,&local_48);
  return;
}

Assistant:

InternalKey(const Slice& user_key, SequenceNumber s, ValueType t) {
    AppendInternalKey(&rep_, ParsedInternalKey(user_key, s, t));
  }